

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase130::run(TestCase130 *this)

{
  bool bVar1;
  anon_class_1_0_00000001 *in_RDX;
  int local_548;
  bool local_541;
  int local_540;
  DebugExpression<int> DStack_53c;
  bool _kj_shouldLog_1;
  undefined1 local_538 [8];
  DebugComparison<int,_int_&> _kjCondition_1;
  bool _kj_shouldLog;
  kj local_4f9;
  Maybe<kj::Exception> local_4f8;
  DebugExpression<kj::Maybe<kj::Exception>_> local_360;
  undefined1 local_1c8 [8];
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition;
  TestCase130 *this_local;
  
  kj::(anonymous_namespace)::TestObject::count = 0;
  kj::(anonymous_namespace)::TestObject::throwAt = 0x10;
  _kjCondition._432_8_ = this;
  runCatchingExceptions<kj::(anonymous_namespace)::TestCase130::run()::__0>
            (&local_4f8,&local_4f9,in_RDX);
  kj::_::DebugExpressionStart::operator<<
            (&local_360,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_4f8);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_1c8,
             (DebugExpression<kj::Maybe<kj::Exception>> *)&local_360,(None *)&kj::none);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>_>::~DebugExpression(&local_360);
  Maybe<kj::Exception>::~Maybe(&local_4f8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1c8);
  if (!bVar1) {
    _kjCondition_1._35_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_1._35_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[95],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array-test.c++"
                 ,0x87,ERROR,
                 "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { heapArray<TestObject>(32); }) != kj::none\", _kjCondition"
                 ,(char (*) [95])
                  "failed: expected ::kj::runCatchingExceptions([&]() { heapArray<TestObject>(32); }) != kj::none"
                 ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_1c8);
      _kjCondition_1._35_1_ = 0;
    }
  }
  kj::_::DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_1c8);
  local_540 = 0;
  DStack_53c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_540);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int_&> *)local_538,&stack0xfffffffffffffac4,
             &kj::(anonymous_namespace)::TestObject::count);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_538);
  if (!bVar1) {
    local_541 = kj::_::Debug::shouldLog(ERROR);
    while (local_541 != false) {
      local_548 = 0;
      kj::_::Debug::log<char_const(&)[44],kj::_::DebugComparison<int,int&>&,int,int&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array-test.c++"
                 ,0x88,ERROR,
                 "\"failed: expected \" \"(0) == (TestObject::count)\", _kjCondition, 0, TestObject::count"
                 ,(char (*) [44])"failed: expected (0) == (TestObject::count)",
                 (DebugComparison<int,_int_&> *)local_538,&local_548,
                 &kj::(anonymous_namespace)::TestObject::count);
      local_541 = false;
    }
  }
  return;
}

Assistant:

TEST(Array, ThrowingConstructor) {
  TestObject::count = 0;
  TestObject::throwAt = 16;

  // If a constructor throws, the previous elements should still be destroyed.
  EXPECT_ANY_THROW(heapArray<TestObject>(32));
  EXPECT_EQ(0, TestObject::count);
}